

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

bool32 rw::ps2::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  FILE *__stream;
  char *pcVar1;
  Error local_58;
  Error _e;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  int32 *pFormat_local;
  int32 *pDepth_local;
  int32 *pHeight_local;
  int32 *pWidth_local;
  int32 type_local;
  Image *img_local;
  
  for (depth = 1; depth < img->width; depth = depth << 1) {
  }
  for (format = 1; format < img->height; format = format << 1) {
  }
  _e.code = img->depth;
  switch(_e.code) {
  case 4:
    _e.plugin = 0x4500;
    break;
  default:
    local_58.plugin = 0xb00;
    local_58.code = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2raster.cpp"
            ,0x641);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x8000000a);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_58);
    return 0;
  case 8:
    _e.plugin = 0x2500;
    break;
  case 0x10:
    _e.plugin = 0x100;
    break;
  case 0x18:
  case 0x20:
    _e.plugin = 0x500;
    _e.code = 0x20;
  }
  *pWidth = depth;
  *pHeight = format;
  *pDepth = _e.code;
  *pFormat = type | _e.plugin;
  return 1;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

	for(width = 1; width < img->width; width <<= 1);
	for(height = 1; height < img->height; height <<= 1);

	depth = img->depth;

	switch(depth){
	case 32:
	case 24:
		// C888 24 bit is unsafe
		format = Raster::C8888;
		depth = 32;
		break;
	case 16:
		format = Raster::C1555;
		break;
	case 8:
		format = Raster::PAL8 | Raster::C8888;
		break;
	case 4:
		format = Raster::PAL4 | Raster::C8888;
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}